

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

void __thiscall
vkb::Swapchain::destroy_image_views
          (Swapchain *this,vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> *image_views)

{
  bool bVar1;
  reference ppVVar2;
  VkImageView_T **image_view;
  const_iterator __end1;
  const_iterator __begin1;
  vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> *__range1;
  vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> *image_views_local;
  Swapchain *this_local;
  
  __end1 = std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::begin(image_views);
  image_view = (VkImageView_T **)
               std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::end(image_views);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<VkImageView_T_*const_*,_std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>_>
                                *)&image_view);
    if (!bVar1) break;
    ppVVar2 = __gnu_cxx::
              __normal_iterator<VkImageView_T_*const_*,_std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>_>
              ::operator*(&__end1);
    (*(this->internal_table).fp_vkDestroyImageView)
              (this->device,*ppVVar2,this->allocation_callbacks);
    __gnu_cxx::
    __normal_iterator<VkImageView_T_*const_*,_std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void Swapchain::destroy_image_views(std::vector<VkImageView> const& image_views) {
    for (auto& image_view : image_views) {
        internal_table.fp_vkDestroyImageView(device, image_view, allocation_callbacks);
    }
}